

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall QInputDialogPrivate::setInputWidget(QInputDialogPrivate *this,QWidget *widget)

{
  bool bVar1;
  QWidget *pQVar2;
  QObject *pQVar3;
  QAbstractSpinBox *this_00;
  
  if (this->inputWidget != widget) {
    if ((QLayout *)this->mainLayout != (QLayout *)0x0) {
      QLayout::removeWidget((QLayout *)this->mainLayout,this->inputWidget);
      QWidget::hide(this->inputWidget);
      QBoxLayout::insertWidget(&this->mainLayout->super_QBoxLayout,1,widget,0,(Alignment)0x0);
      QWidget::show(widget);
      pQVar2 = (QWidget *)QDialogButtonBox::button((QDialogButtonBox *)this->buttonBox,FirstButton);
      pQVar3 = (QObject *)QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject);
      if (pQVar3 != (QObject *)0x0) {
        QObject::disconnect(pQVar3,"2textChanged(bool)",(QObject *)pQVar2,"1setEnabled(bool)");
      }
      this_00 = (QAbstractSpinBox *)
                QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject);
      ensureEnabledConnection(this,(QAbstractSpinBox *)this_00);
      if (this_00 == (QAbstractSpinBox *)0x0) {
        bVar1 = true;
      }
      else {
        bVar1 = QAbstractSpinBox::hasAcceptableInput(this_00);
      }
      QWidget::setEnabled(pQVar2,bVar1);
    }
    this->inputWidget = widget;
    if (&this->lineEdit->super_QWidget == widget) {
      QLineEdit::setText((QLineEdit *)&this->lineEdit->super_QWidget,&this->textValue);
      return;
    }
    if ((QWidget *)this->plainTextEdit == widget) {
      QPlainTextEdit::setPlainText(this->plainTextEdit,&this->textValue);
      return;
    }
    if (&this->comboBox->super_QWidget == widget) {
      setComboBoxText(this,&this->textValue);
      return;
    }
    if ((QWidget *)this->listView == widget) {
      setListViewText(this,&this->textValue);
      ensureLayout(this);
      pQVar2 = (QWidget *)QDialogButtonBox::button((QDialogButtonBox *)this->buttonBox,FirstButton);
      QAbstractItemView::selectionModel((QAbstractItemView *)this->listView);
      bVar1 = (bool)QItemSelectionModel::hasSelection();
      QWidget::setEnabled(pQVar2,bVar1);
      return;
    }
  }
  return;
}

Assistant:

void QInputDialogPrivate::setInputWidget(QWidget *widget)
{
    Q_ASSERT(widget);
    if (inputWidget == widget)
        return;

    if (mainLayout) {
        Q_ASSERT(inputWidget);
        mainLayout->removeWidget(inputWidget);
        inputWidget->hide();
        mainLayout->insertWidget(1, widget);
        widget->show();

        // disconnect old input widget
        QAbstractButton *okButton = buttonBox->button(QDialogButtonBox::Ok);
        if (QAbstractSpinBox *spinBox = qobject_cast<QAbstractSpinBox *>(inputWidget))
            QObject::disconnect(spinBox, SIGNAL(textChanged(bool)), okButton, SLOT(setEnabled(bool)));

        // connect new input widget and update enabled state of OK button
        QAbstractSpinBox *spinBox = qobject_cast<QAbstractSpinBox *>(widget);
        ensureEnabledConnection(spinBox);
        okButton->setEnabled(!spinBox || spinBox->hasAcceptableInput());
    }

    inputWidget = widget;

    // synchronize the text shown in the new text editor with the current
    // textValue
    if (widget == lineEdit) {
        lineEdit->setText(textValue);
    } else if (widget == plainTextEdit) {
        plainTextEdit->setPlainText(textValue);
    } else if (widget == comboBox) {
        setComboBoxText(textValue);
    } else if (widget == listView) {
        setListViewText(textValue);
        ensureLayout();
        buttonBox->button(QDialogButtonBox::Ok)->setEnabled(listView->selectionModel()->hasSelection());
    }
}